

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF8ToUTF16(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  ushort *puVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  iVar8 = (int)outb;
  iVar4 = (int)in;
  if (in == (uchar *)0x0) {
    if (1 < *outlen) {
      outb[0] = 0xff;
      outb[1] = 0xfe;
      *outlen = 2;
      *inlen = 0;
      return 2;
    }
    *outlen = 0;
    *inlen = 0;
    return 0;
  }
  iVar6 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && outb != (uchar *)0x0)) {
    if (in != (uchar *)0x0) {
      if (0 < (long)*inlen) {
        pbVar9 = in + *inlen;
        puVar1 = (ushort *)(outb + (long)(*outlen / 2) * 2);
        do {
          bVar2 = *in;
          uVar5 = (uint)bVar2;
          lVar7 = 0;
          if ((char)bVar2 < '\0') {
            if (bVar2 < 0xc0) {
LAB_001444c4:
              *outlen = (int)outb - iVar8;
              *inlen = (int)in - iVar4;
              return -2;
            }
            if (bVar2 < 0xe0) {
              uVar5 = bVar2 & 0x1f;
              lVar7 = 1;
            }
            else if (bVar2 < 0xf0) {
              uVar5 = bVar2 & 0xf;
              lVar7 = 2;
            }
            else {
              if (0xf7 < bVar2) goto LAB_001444c4;
              uVar5 = bVar2 & 7;
              lVar7 = 3;
            }
          }
          pbVar10 = in + 1;
          iVar6 = (int)lVar7;
          if ((long)pbVar9 - (long)pbVar10 < lVar7) break;
          if (pbVar10 < pbVar9 && (char)bVar2 < '\0') {
            pbVar3 = in + 2;
            do {
              pbVar10 = pbVar3;
              iVar6 = iVar6 + -1;
              if (((pbVar10[-1] & 0xffffffc0) != 0x80) ||
                 (uVar5 = pbVar10[-1] & 0x3f | uVar5 << 6, iVar6 == 0)) break;
              pbVar3 = pbVar10 + 1;
            } while (pbVar10 < pbVar9);
            if (uVar5 < 0x10000) goto LAB_0014444e;
            if ((0x10ffff < uVar5) || (puVar1 <= (ushort *)((long)outb + 2))) break;
            *(ushort *)outb = (ushort)(uVar5 + 0xff0000 >> 10) | 0xd800;
            *(ushort *)((long)outb + 2) = (ushort)uVar5 & 0x3ff | 0xdc00;
            outb = (uchar *)((long)outb + 4);
            in = pbVar10;
          }
          else {
LAB_0014444e:
            if (puVar1 <= outb) break;
            *(ushort *)outb = (ushort)uVar5;
            outb = (uchar *)((long)outb + 2);
            in = pbVar10;
          }
          if (pbVar9 <= in) break;
        } while( true );
      }
      *outlen = (int)outb - iVar8;
      *inlen = (int)in - iVar4;
      return *outlen;
    }
    iVar6 = 0;
    *outlen = 0;
    *inlen = 0;
  }
  return iVar6;
}

Assistant:

static int
UTF8ToUTF16(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    if (in == NULL) {
	/*
	 * initialization, add the Byte Order Mark for UTF-16LE
	 */
        if (*outlen >= 2) {
	    outb[0] = 0xFF;
	    outb[1] = 0xFE;
	    *outlen = 2;
	    *inlen = 0;
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
		    "Added FFFE Byte Order Mark\n");
#endif
	    return(2);
	}
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    return (UTF8ToUTF16LE(outb, outlen, in, inlen));
}